

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

bool __thiscall duckdb::Linenoise::EditMoveRowDown(Linenoise *this)

{
  bool bVar1;
  size_t sVar2;
  int cursor_col;
  int cols;
  int rows;
  allocator local_51;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  string local_40 [32];
  
  bVar1 = Terminal::IsMultiline();
  if (bVar1) {
    PositionToColAndRow(this,this->pos,&local_4c,&local_50,&local_44,&local_48);
    bVar1 = local_4c < local_44;
    if (local_4c < local_44) {
      ::std::__cxx11::string::string(local_40,"source pos %d",&local_51);
      ::std::__cxx11::string::~string(local_40);
      ::std::__cxx11::string::string(local_40,"move from row %d to row %d",&local_51);
      ::std::__cxx11::string::~string(local_40);
      sVar2 = ColAndRowToPosition(this,local_4c + 1,local_50);
      this->pos = sVar2;
      ::std::__cxx11::string::string(local_40,"new pos %d",&local_51);
      ::std::__cxx11::string::~string(local_40);
      RefreshLine(this);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Linenoise::EditMoveRowDown() {
	if (!Terminal::IsMultiline()) {
		return false;
	}
	int rows, cols;
	int cursor_row, cursor_col;
	PositionToColAndRow(pos, cursor_row, cursor_col, rows, cols);
	if (cursor_row >= rows) {
		return false;
	}
	// we can move the cursor a line down
	Linenoise::Log("source pos %d", pos);
	Linenoise::Log("move from row %d to row %d", cursor_row, cursor_row + 1);
	cursor_row++;
	pos = ColAndRowToPosition(cursor_row, cursor_col);
	Linenoise::Log("new pos %d", pos);
	RefreshLine();
	return true;
}